

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

optional<tinyusdz::value::vector3h> * __thiscall
tinyusdz::Attribute::get_value<tinyusdz::value::vector3h>
          (optional<tinyusdz::value::vector3h> *__return_storage_ptr__,Attribute *this)

{
  optional<tinyusdz::value::vector3h> in_RAX;
  optional<tinyusdz::value::vector3h> local_18;
  
  local_18 = in_RAX;
  primvar::PrimVar::get_value<tinyusdz::value::vector3h>(&local_18,&this->_var);
  __return_storage_ptr__->has_value_ = local_18.has_value_;
  if (local_18.has_value_ == true) {
    *(undefined2 *)((long)&__return_storage_ptr__->contained + 4) = local_18.contained._4_2_;
    *(undefined4 *)&__return_storage_ptr__->contained = local_18.contained._0_4_;
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    return _var.get_value<T>();
  }